

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_fast_extDict
              (char *source,char *dest,int originalSize,void *dictStart,size_t dictSize)

{
  byte bVar1;
  ushort uVar2;
  char *pcVar3;
  uint uVar4;
  size_t l;
  long lVar5;
  ulong uVar6;
  ushort *puVar7;
  ulong uVar8;
  void *__src;
  char *pcVar9;
  char *pcVar10;
  byte *__src_00;
  ushort *puVar11;
  ulong uVar12;
  size_t l_1;
  int local_48;
  
  pcVar9 = dest + originalSize;
  puVar7 = (ushort *)source;
  pcVar10 = dest;
  while( true ) {
    uVar2 = *puVar7;
    __src_00 = (byte *)((long)puVar7 + 1);
    uVar4 = (uint)(byte)((byte)uVar2 >> 4);
    uVar6 = (ulong)uVar4;
    if (uVar4 == 0xf) {
      lVar5 = 0;
      do {
        bVar1 = *__src_00;
        __src_00 = __src_00 + 1;
        lVar5 = lVar5 + (ulong)bVar1;
      } while ((ulong)bVar1 == 0xff);
      uVar6 = lVar5 + 0xf;
    }
    if ((ulong)((long)pcVar9 - (long)pcVar10) < uVar6) {
      return -1;
    }
    memmove(pcVar10,__src_00,uVar6);
    pcVar10 = pcVar10 + uVar6;
    puVar11 = (ushort *)(__src_00 + uVar6);
    if ((ulong)((long)pcVar9 - (long)pcVar10) < 0xc) {
      if (pcVar10 != pcVar9) {
        return -1;
      }
      local_48 = (int)source;
      return (int)puVar11 - local_48;
    }
    uVar6 = (ulong)((byte)uVar2 & 0xf);
    puVar7 = puVar11 + 1;
    if (uVar6 == 0xf) {
      lVar5 = 0;
      do {
        uVar2 = *puVar7;
        puVar7 = (ushort *)((long)puVar7 + 1);
        lVar5 = lVar5 + (ulong)(byte)uVar2;
      } while ((ulong)(byte)uVar2 == 0xff);
      uVar6 = lVar5 + 0xf;
    }
    uVar6 = uVar6 + 4;
    if ((ulong)((long)pcVar9 - (long)pcVar10) < uVar6) break;
    uVar12 = (ulong)*puVar11;
    uVar8 = (long)pcVar10 - (long)dest;
    if (uVar8 + dictSize < uVar12) {
      return -1;
    }
    if (uVar8 < uVar12) {
      __src = (void *)((long)dictStart + (uVar8 - uVar12) + dictSize);
      uVar12 = (long)dictStart + (dictSize - (long)__src);
      uVar8 = uVar6 - uVar12;
      if (uVar6 < uVar12) {
        memmove(pcVar10,__src,uVar6);
        uVar8 = 0;
        uVar12 = uVar6;
      }
      else {
        memmove(pcVar10,__src,uVar12);
      }
      pcVar10 = pcVar10 + uVar12;
      pcVar3 = dest;
      uVar6 = uVar8;
    }
    else {
      pcVar3 = pcVar10 + -uVar12;
    }
    if (uVar6 != 0) {
      uVar12 = 0;
      do {
        pcVar10[uVar12] = pcVar3[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar6 != uVar12);
    }
    pcVar10 = pcVar10 + uVar6;
    if ((ulong)((long)pcVar9 - (long)pcVar10) < 5) {
      return -1;
    }
  }
  return -1;
}

Assistant:

LZ4_FORCE_O2
static int LZ4_decompress_fast_extDict(const char* source, char* dest, int originalSize,
                                       const void* dictStart, size_t dictSize)
{
    return LZ4_decompress_unsafe_generic(
                (const BYTE*)source, (BYTE*)dest, originalSize,
                0, (const BYTE*)dictStart, dictSize);
}